

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_cli.c
# Opt level: O0

void ssl_write_max_fragment_length_ext(mbedtls_ssl_context *ssl,uchar *buf,size_t *olen)

{
  uchar *p;
  size_t *olen_local;
  uchar *buf_local;
  mbedtls_ssl_context *ssl_local;
  
  if (ssl->session_negotiate->mfl_code == '\0') {
    *olen = 0;
  }
  else {
    mbedtls_debug_print_msg
              (ssl,3,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_srv.c"
               ,0x7ad,"server hello, max_fragment_length extension");
    *buf = '\0';
    buf[1] = '\x01';
    buf[2] = '\0';
    buf[3] = '\x01';
    buf[4] = ssl->session_negotiate->mfl_code;
    *olen = 5;
  }
  return;
}

Assistant:

static void ssl_write_max_fragment_length_ext( mbedtls_ssl_context *ssl,
                                               unsigned char *buf,
                                               size_t *olen )
{
    unsigned char *p = buf;
    const unsigned char *end = ssl->out_msg + MBEDTLS_SSL_MAX_CONTENT_LEN;

    *olen = 0;

    if( ssl->conf->mfl_code == MBEDTLS_SSL_MAX_FRAG_LEN_NONE ) {
        return;
    }

    MBEDTLS_SSL_DEBUG_MSG( 3, ( "client hello, adding max_fragment_length extension" ) );

    if( end < p || (size_t)( end - p ) < 5 )
    {
        MBEDTLS_SSL_DEBUG_MSG( 1, ( "buffer too small" ) );
        return;
    }

    *p++ = (unsigned char)( ( MBEDTLS_TLS_EXT_MAX_FRAGMENT_LENGTH >> 8 ) & 0xFF );
    *p++ = (unsigned char)( ( MBEDTLS_TLS_EXT_MAX_FRAGMENT_LENGTH      ) & 0xFF );

    *p++ = 0x00;
    *p++ = 1;

    *p++ = ssl->conf->mfl_code;

    *olen = 5;
}